

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomimp.cpp
# Opt level: O1

int AF_A_TroopAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *self;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  PClass *pPVar8;
  PClassActor *type;
  AActor *pAVar9;
  char *__assertion;
  bool bVar10;
  FName local_38;
  FSoundID local_34;
  DAngle local_30;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005924e4;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    self = *(AActor **)&param->field_0;
    if (self != (AActor *)0x0) {
      if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
        (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar8 = (self->super_DThinker).super_DObject.Class;
      bVar10 = pPVar8 != (PClass *)0x0;
      if (pPVar8 != pPVar3 && bVar10) {
        do {
          pPVar8 = pPVar8->ParentClass;
          bVar10 = pPVar8 != (PClass *)0x0;
          if (pPVar8 == pPVar3) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if (!bVar10) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005924e4;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005924b9;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar7 = (**(code **)*puVar2)(puVar2);
          puVar2[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar2[1];
        bVar10 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar3 && bVar10) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar10 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar3) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar10) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005924e4;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      pAVar9 = (self->target).field_0.p;
      if (pAVar9 != (AActor *)0x0) {
        if (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          A_FaceTarget(self);
          bVar10 = AActor::CheckMeleeRange(self);
          if (bVar10) {
            uVar5 = FRandom::GenRand32(&pr_troopattack);
            iVar4 = (uVar5 & 7) * 3 + 3;
            local_34.ID = S_FindSound("imp/melee");
            S_Sound(self,1,&local_34,1.0,1.0);
            pAVar9 = (self->target).field_0.p;
            if ((pAVar9 != (AActor *)0x0) &&
               (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (self->target).field_0.p = (AActor *)0x0;
              pAVar9 = (AActor *)0x0;
            }
            local_38.Index = 0x84;
            local_30.Degrees = 0.0;
            iVar6 = P_DamageMobj(pAVar9,self,self,iVar4,&local_38,0,&local_30);
            if (0 < iVar6) {
              iVar4 = iVar6;
            }
            pAVar9 = (self->target).field_0.p;
            if ((pAVar9 != (AActor *)0x0) &&
               (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (self->target).field_0.p = (AActor *)0x0;
              pAVar9 = (AActor *)0x0;
            }
            P_TraceBleed(iVar4,pAVar9,self);
          }
          else {
            pAVar9 = (self->target).field_0.p;
            if ((pAVar9 != (AActor *)0x0) &&
               (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (self->target).field_0.p = (AActor *)0x0;
              pAVar9 = (AActor *)0x0;
            }
            type = PClass::FindActor("DoomImpBall");
            P_SpawnMissile(self,pAVar9,type,(AActor *)0x0);
          }
        }
        else {
          (self->target).field_0.p = (AActor *)0x0;
        }
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005924b9:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005924e4:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomimp.cpp"
                ,0x14,"int AF_A_TroopAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_TroopAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target)
		return 0;
				
	A_FaceTarget (self);
	if (self->CheckMeleeRange ())
	{
		int damage = (pr_troopattack()%8+1)*3;
		S_Sound (self, CHAN_WEAPON, "imp/melee", 1, ATTN_NORM);
		int newdam = P_DamageMobj (self->target, self, self, damage, NAME_Melee);
		P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
		return 0;
	}
	
	// launch a missile
	P_SpawnMissile (self, self->target, PClass::FindActor("DoomImpBall"));
	return 0;
}